

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

_Bool MatrixSetElement(Matrix *a,uint32_t rows,uint32_t columns,Real value)

{
  Real value_local;
  uint32_t columns_local;
  uint32_t rows_local;
  Matrix *a_local;
  
  if ((rows < a->rows) && (columns < a->columns)) {
    *(unkbyte10 *)(a->matrix + (columns + a->columns * rows)) = value._0_10_;
    a_local._7_1_ = true;
  }
  else {
    fprintf(_stderr,"%s: Invalid element indices (rows:%d<%d, columns:%d<%d)\n","MatrixSetElement",
            (ulong)rows,(ulong)a->rows,(ulong)columns,a->columns);
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool MatrixSetElement(Matrix *a, uint32_t rows, uint32_t columns, Real value) {
#ifndef NDEBUG
  if (a->rows <= rows || a->columns <= columns) {
    fprintf(stderr, "%s: Invalid element indices (rows:%d<%d, columns:%d<%d)\n", __FUNCTION_NAME__, rows, a->rows, columns, a->columns);
    return false;
  }
#endif
  a->matrix[columns + a->columns * rows] = value;
  return true;
}